

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_> *
testing::internal::
ActionResultHolder<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>::
PerformDefaultAction<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&,std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&)>
          (FunctionMocker<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
           *func_mocker,ArgumentTuple *args,string *call_description)

{
  _Manager_type p_Var1;
  _Invoker_type p_Var2;
  SDL_Texture_conflict *pSVar3;
  ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_> *pAVar4;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  undefined8 local_58;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  SDL_Texture_conflict *local_28;
  
  pAVar4 = (ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>
            *)operator_new(0x30);
  FunctionMocker<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::PerformDefaultAction((Result *)&local_48,func_mocker,args,call_description);
  pSVar3 = local_28;
  p_Var2 = p_Stack_30;
  p_Var1 = local_38;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = p_Stack_30;
  if (local_38 != (_Manager_type)0x0) {
    local_78._M_unused._M_object = local_48._M_unused._M_object;
    local_78._8_8_ = local_48._8_8_;
    local_68 = local_38;
    local_38 = (_Manager_type)0x0;
    p_Stack_30 = (_Invoker_type)0x0;
  }
  local_28 = (SDL_Texture_conflict *)0x0;
  (pAVar4->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_003248a8;
  *(undefined8 *)
   &(pAVar4->result_).value_._M_t.
    super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Texture_*)>,_false> = 0;
  *(undefined8 *)
   ((long)&(pAVar4->result_).value_._M_t.
           super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_> + 8) = 0;
  *(_Manager_type *)
   ((long)&(pAVar4->result_).value_._M_t.
           super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_> + 0x10) = (_Manager_type)0x0
  ;
  *(_Invoker_type *)
   ((long)&(pAVar4->result_).value_._M_t.
           super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_> + 0x18) = p_Var2;
  if (p_Var1 != (_Manager_type)0x0) {
    *(void **)&(pAVar4->result_).value_._M_t.
               super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
               super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
               super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_>.
               super__Head_base<1UL,_std::function<void_(SDL_Texture_*)>,_false> =
         local_78._M_unused._M_object;
    *(undefined8 *)
     ((long)&(pAVar4->result_).value_._M_t.
             super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_> + 8) = local_78._8_8_;
    *(_Manager_type *)
     ((long)&(pAVar4->result_).value_._M_t.
             super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_> + 0x10) = p_Var1;
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)0x0;
  }
  (pAVar4->result_).value_._M_t.
  super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
  super__Head_base<0UL,_SDL_Texture_*,_false>._M_head_impl = pSVar3;
  local_58 = 0;
  std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *)&local_78);
  std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *)&local_48);
  return pAVar4;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }